

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qipaddress.cpp
# Opt level: O3

QChar * QIPAddressUtils::parseIp6(IPv6Address *address,QChar *begin,QChar *end)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  QChar *pQVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  int iVar15;
  long in_FS_OFFSET;
  QSimpleParsedNumber<unsigned_long_long> QVar16;
  IPv4Address ip4;
  IPv4Address local_94;
  undefined1 local_90 [32];
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_90._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_90._0_8_ = 0x40;
  local_90._8_8_ = 0;
  local_90._16_8_ = local_90 + 0x18;
  pQVar7 = checkedToAscii((Buffer *)local_90,begin,end);
  uVar3 = local_90._16_8_;
  uVar2 = local_90._8_8_;
  if (pQVar7 == (QChar *)0x0) {
    iVar15 = 0;
    iVar5 = 0;
    pcVar14 = (char *)local_90._16_8_;
    do {
      cVar1 = *pcVar14;
      if (cVar1 == ':') {
        iVar15 = iVar15 + 1;
      }
      else if (cVar1 == '\0') goto LAB_0024718d;
      iVar5 = iVar5 + (uint)(cVar1 == '.');
      pcVar14 = pcVar14 + 1;
    } while( true );
  }
  goto LAB_002471f9;
code_r0x002472cb:
  pcVar14 = pcVar14 + lVar12 + 1;
  lVar12 = lVar8 + lVar11;
  lVar11 = lVar11 + 2;
  if (0xc < lVar12) {
LAB_00247347:
    iVar13 = iVar13 + iVar9 + 2;
    goto LAB_00247351;
  }
  goto LAB_0024727f;
LAB_0024718d:
  pQVar7 = end;
  if ((iVar5 == 3) || (iVar5 == 0)) {
    *(quint8 *)((long)address + 0) = '\0';
    *(quint8 *)((long)address + 1) = '\0';
    *(quint8 *)((long)address + 2) = '\0';
    *(quint8 *)((long)address + 3) = '\0';
    *(quint8 *)((long)address + 4) = '\0';
    *(quint8 *)((long)address + 5) = '\0';
    *(quint8 *)((long)address + 6) = '\0';
    *(quint8 *)((long)address + 7) = '\0';
    *(quint8 *)((long)address + 8) = '\0';
    *(quint8 *)((long)address + 9) = '\0';
    *(quint8 *)((long)address + 10) = '\0';
    *(quint8 *)((long)address + 0xb) = '\0';
    *(quint8 *)((long)address + 0xc) = '\0';
    *(quint8 *)((long)address + 0xd) = '\0';
    *(quint8 *)((long)address + 0xe) = '\0';
    *(quint8 *)((long)address + 0xf) = '\0';
    if ((long)end - (long)begin == 4 && iVar15 == 2) {
LAB_002471b7:
      pQVar7 = (QChar *)0x0;
    }
    else if ((((*(char *)local_90._16_8_ == ':') &&
              (iVar10 = 9, *(char *)(local_90._16_8_ + 1) == ':')) ||
             ((lVar11 = (long)end - (long)begin >> 1,
              *(char *)(local_90._16_8_ + lVar11 + -2) == ':' &&
              (iVar10 = 9, *(char *)(local_90._16_8_ + lVar11 + -1) == ':')))) ||
            (iVar10 = 8, 0xfffffff9 < iVar15 - 8U)) {
      pcVar14 = (char *)local_90._16_8_;
      iVar5 = (-iVar15 - (uint)(iVar5 != 0)) + iVar10;
      iVar10 = 0;
      do {
        iVar9 = iVar10;
        iVar6 = iVar5;
        lVar8 = (long)iVar9;
        lVar11 = 0;
LAB_0024727f:
        iVar13 = (int)lVar11;
        if (*pcVar14 != ':') {
          QVar16 = qstrntoull(pcVar14,(qsizetype)(uVar3 + (uVar2 - (long)pcVar14)),0x10);
          lVar12 = QVar16.used;
          if (lVar12 - 5U < 0xfffffffffffffffc) goto LAB_00247372;
          if (pcVar14[lVar12] != '.') {
            (*address)[lVar11 + lVar8] = QVar16.result._1_1_;
            (*address)[lVar11 + lVar8 + 1] = (quint8)QVar16.result;
            cVar1 = pcVar14[lVar12];
            if (cVar1 == ':') goto code_r0x002472cb;
            if (cVar1 == '\0') goto LAB_00247347;
            pQVar7 = begin + ((long)(pcVar14 + lVar12) - local_90._16_8_);
            goto LAB_002471f9;
          }
          if (lVar8 + lVar11 != 0xc) goto LAB_00247372;
          local_94 = 0xaaaaaaaa;
          bVar4 = parseIp4Internal(&local_94,pcVar14,false);
          if (!bVar4) {
            pQVar7 = begin + ((long)pcVar14 - local_90._16_8_);
            goto LAB_002471f9;
          }
          *(IPv4Address *)(*address + 0xc) =
               local_94 >> 0x18 | (local_94 & 0xff0000) >> 8 | (local_94 & 0xff00) << 8 |
               local_94 << 0x18;
          goto LAB_002471b7;
        }
        if (iVar6 < 1) {
LAB_00247372:
          pQVar7 = begin + ((long)pcVar14 - local_90._16_8_);
          goto LAB_002471f9;
        }
        if ((lVar8 + lVar11 == 0) || (iVar15 * 2 - iVar9 == iVar13)) {
          if (pcVar14[1] != ':') goto LAB_00247372;
          pcVar14 = pcVar14 + 1;
        }
        iVar10 = iVar9 + iVar6 * 2 + iVar13;
        pcVar14 = pcVar14 + 1;
        iVar5 = 0;
      } while (iVar10 < 0xf);
      iVar13 = iVar13 + iVar9 + iVar6 * 2;
LAB_00247351:
      if (iVar13 == 0x10) {
        pQVar7 = (QChar *)0x0;
      }
    }
  }
LAB_002471f9:
  if ((undefined1 *)local_90._16_8_ != local_90 + 0x18) {
    QtPrivate::sizedFree((void *)local_90._16_8_,local_90._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar7;
}

Assistant:

const QChar *parseIp6(IPv6Address &address, const QChar *begin, const QChar *end)
{
    Q_ASSERT(begin != end);
    Buffer buffer;
    const QChar *ret = checkedToAscii(buffer, begin, end);
    if (ret)
        return ret;

    const char *ptr = buffer.data();
    const char *const stop = ptr + buffer.size();

    // count the colons
    int colonCount = 0;
    int dotCount = 0;
    while (*ptr) {
        if (*ptr == ':')
            ++colonCount;
        if (*ptr == '.')
            ++dotCount;
        ++ptr;
    }
    // IPv4-in-IPv6 addresses are stricter in what they accept
    if (dotCount != 0 && dotCount != 3)
        return end;

    memset(address, 0, sizeof address);
    if (colonCount == 2 && end - begin == 2) // "::"
        return nullptr;

    // if there's a double colon ("::"), this is how many zeroes it means
    int zeroWordsToFill;
    ptr = buffer.data();

    // there are two cases where 8 colons are allowed: at the ends
    // so test that before the colon-count test
    if ((ptr[0] == ':' && ptr[1] == ':') ||
            (ptr[end - begin - 2] == ':' && ptr[end - begin - 1] == ':')) {
        zeroWordsToFill = 9 - colonCount;
    } else if (colonCount < 2 || colonCount > 7) {
        return end;
    } else {
        zeroWordsToFill = 8 - colonCount;
    }
    if (dotCount)
        --zeroWordsToFill;

    int pos = 0;
    while (pos < 15) {
        if (*ptr == ':') {
            // empty field, we hope it's "::"
            if (zeroWordsToFill < 1)
                return begin + (ptr - buffer.data());
            if (pos == 0 || pos == colonCount * 2) {
                if (ptr[0] == '\0' || ptr[1] != ':')
                    return begin + (ptr - buffer.data());
                ++ptr;
            }
            pos += zeroWordsToFill * 2;
            zeroWordsToFill = 0;
            ++ptr;
            continue;
        }

        auto [ll, used] = qstrntoull(ptr, stop - ptr, 16);
        quint16 x = ll;

        // Reject malformed fields:
        // - failed to parse
        // - too many hex digits
        if (used <= 0 || used > 4)
            return begin + (ptr - buffer.data());

        if (ptr[used] == '.') {
            // this could be an IPv4 address
            // it's only valid in the last element
            if (pos != 12)
                return begin + (ptr - buffer.data());

            IPv4Address ip4;
            if (!parseIp4Internal(ip4, ptr, false))
                return begin + (ptr - buffer.data());

            address[12] = ip4 >> 24;
            address[13] = ip4 >> 16;
            address[14] = ip4 >> 8;
            address[15] = ip4;
            return nullptr;
        }

        address[pos++] = x >> 8;
        address[pos++] = x & 0xff;

        if (ptr[used] == '\0')
            break;
        if (ptr[used] != ':')
            return begin + (used + ptr - buffer.data());
        ptr += used + 1;
    }
    return pos == 16 ? nullptr : end;
}